

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void __thiscall FMapInfoParser::ParseMapDefinition(FMapInfoParser *this,level_info_t *info)

{
  FMapOptInfo *pFVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  FMapOptInfo **ppFVar6;
  
  ParseOpenBrace(this);
  bVar2 = FScanner::GetString(&this->sc);
  if (!bVar2) {
LAB_004e3163:
    CheckEndOfFile(this,"map");
    return;
  }
LAB_004e2f39:
  uVar3 = FScanner::MatchString(&this->sc,&MapFlagHandlers[0].name,0x18);
  ppFVar6 = &mapopt_fogdensity;
  if ((int)uVar3 < 0) {
    do {
      pFVar1 = *ppFVar6;
      if ((FMapOptInfo **)((long)&mapopt_fs_nocheckposition + 7) < ppFVar6 ||
          pFVar1 != (FMapOptInfo *)0x0) {
        if (pFVar1 == (FMapOptInfo *)0x0) {
          bVar2 = ParseCloseBrace(this);
          if (bVar2) goto LAB_004e3163;
          FScanner::ScriptMessage
                    (&this->sc,"Unknown property \'%s\' found in map definition\n",(this->sc).String
                    );
          SkipToNext(this);
          goto switchD_004e2f7e_caseD_0;
        }
        bVar2 = FScanner::Compare(&this->sc,pFVar1->name);
        if (bVar2) goto code_r0x004e2fd2;
      }
      ppFVar6 = ppFVar6 + 1;
    } while( true );
  }
  switch(MapFlagHandlers[uVar3].type) {
  case MITYPE_IGNORE:
    break;
  case MITYPE_EATNEXT:
    if (this->format_type == 2) {
      FScanner::MustGetStringName(&this->sc,"=");
    }
    FScanner::MustGetString(&this->sc);
    break;
  case MITYPE_SETFLAG:
    uVar4 = info->flags | MapFlagHandlers[uVar3].data1;
    goto LAB_004e309b;
  case MITYPE_CLRFLAG:
    uVar4 = ~MapFlagHandlers[uVar3].data1 & info->flags;
LAB_004e309b:
    uVar4 = uVar4 | MapFlagHandlers[uVar3].data2;
LAB_004e309f:
    info->flags = uVar4;
    break;
  case MITYPE_SCFLAGS:
    uVar4 = MapFlagHandlers[uVar3].data2 & info->flags | MapFlagHandlers[uVar3].data1;
    goto LAB_004e309f;
  case MITYPE_SETFLAG2:
    uVar4 = info->flags2 | MapFlagHandlers[uVar3].data1;
    goto LAB_004e30ca;
  case MITYPE_CLRFLAG2:
    uVar4 = ~MapFlagHandlers[uVar3].data1 & info->flags2;
LAB_004e30ca:
    uVar4 = uVar4 | MapFlagHandlers[uVar3].data2;
LAB_004e30ce:
    info->flags2 = uVar4;
    break;
  case MITYPE_SCFLAGS2:
    uVar4 = MapFlagHandlers[uVar3].data2 & info->flags2 | MapFlagHandlers[uVar3].data1;
    goto LAB_004e30ce;
  case MITYPE_SETFLAG3:
    uVar4 = info->flags3 | MapFlagHandlers[uVar3].data1;
    goto LAB_004e30ea;
  case MITYPE_CLRFLAG3:
    uVar4 = ~MapFlagHandlers[uVar3].data1 & info->flags3;
LAB_004e30ea:
    uVar4 = uVar4 | MapFlagHandlers[uVar3].data2;
LAB_004e30ee:
    info->flags3 = uVar4;
    break;
  case MITYPE_SCFLAGS3:
    uVar4 = MapFlagHandlers[uVar3].data2 & info->flags3 | MapFlagHandlers[uVar3].data1;
    goto LAB_004e30ee;
  case MITYPE_COMPATFLAG:
    if (this->format_type == 2) {
      bVar2 = FScanner::CheckString(&this->sc,"=");
      if (!bVar2) goto LAB_004e3126;
      FScanner::MustGetNumber(&this->sc);
LAB_004e3100:
      if ((this->sc).Number != 0) goto LAB_004e3126;
      uVar4 = MapFlagHandlers[uVar3].data1;
      info->compatflags = info->compatflags & ~uVar4;
      uVar3 = MapFlagHandlers[uVar3].data2;
      uVar5 = ~uVar3 & info->compatflags2;
    }
    else {
      bVar2 = FScanner::CheckNumber(&this->sc);
      if (bVar2) goto LAB_004e3100;
LAB_004e3126:
      uVar4 = MapFlagHandlers[uVar3].data1;
      info->compatflags = info->compatflags | uVar4;
      uVar3 = MapFlagHandlers[uVar3].data2;
      uVar5 = info->compatflags2 | uVar3;
    }
    info->compatflags2 = uVar5;
    info->compatmask = info->compatmask | uVar4;
    info->compatmask2 = info->compatmask2 | uVar3;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_mapinfo.cpp"
                  ,0x5b2,"void FMapInfoParser::ParseMapDefinition(level_info_t &)");
  }
  goto switchD_004e2f7e_caseD_0;
code_r0x004e2fd2:
  if ((pFVar1->old == false) && (this->format_type != 2)) {
    FScanner::ScriptError
              (&this->sc,"MAPINFO option \'%s\' requires the new MAPINFO format",(this->sc).String);
  }
  (*pFVar1->handler)(this,info);
switchD_004e2f7e_caseD_0:
  bVar2 = FScanner::GetString(&this->sc);
  if (!bVar2) goto LAB_004e3163;
  goto LAB_004e2f39;
}

Assistant:

void FMapInfoParser::ParseMapDefinition(level_info_t &info)
{
	int index;

	ParseOpenBrace();

	while (sc.GetString())
	{
		if ((index = sc.MatchString(&MapFlagHandlers->name, sizeof(*MapFlagHandlers))) >= 0)
		{
			MapInfoFlagHandler *handler = &MapFlagHandlers[index];
			switch (handler->type)
			{
			case MITYPE_EATNEXT:
				ParseAssign();
				sc.MustGetString();
				break;

			case MITYPE_IGNORE:
				break;

			case MITYPE_SETFLAG:
				info.flags |= handler->data1;
				info.flags |= handler->data2;
				break;

			case MITYPE_CLRFLAG:
				info.flags &= ~handler->data1;
				info.flags |= handler->data2;
				break;

			case MITYPE_SCFLAGS:
				info.flags = (info.flags & handler->data2) | handler->data1;
				break;

			case MITYPE_SETFLAG2:
				info.flags2 |= handler->data1;
				info.flags2 |= handler->data2;
				break;

			case MITYPE_CLRFLAG2:
				info.flags2 &= ~handler->data1;
				info.flags2 |= handler->data2;
				break;

			case MITYPE_SCFLAGS2:
				info.flags2 = (info.flags2 & handler->data2) | handler->data1;
				break;

			case MITYPE_SETFLAG3:
				info.flags3 |= handler->data1;
				info.flags3 |= handler->data2;
				break;

			case MITYPE_CLRFLAG3:
				info.flags3 &= ~handler->data1;
				info.flags3 |= handler->data2;
				break;

			case MITYPE_SCFLAGS3:
				info.flags3 = (info.flags3 & handler->data2) | handler->data1;
				break;

			case MITYPE_COMPATFLAG:
			{
				int set = 1;
				if (format_type == FMT_New)
				{
					if (CheckAssign())
					{
						sc.MustGetNumber();
						set = sc.Number;
					}
				}
				else
				{
					if (sc.CheckNumber()) set = sc.Number;
				}

				if (set)
				{
					info.compatflags |= handler->data1;
					info.compatflags2 |= handler->data2;
				}
				else
				{
					info.compatflags &= ~handler->data1;
					info.compatflags2 &= ~handler->data2;
				}
				info.compatmask |= handler->data1;
				info.compatmask2 |= handler->data2;
			}
			break;

			default:
				// should never happen
				assert(false);
				break;
			}
		}
		else
		{
			FAutoSegIterator probe(YRegHead, YRegTail);
			bool success = false;

			while (*++probe != NULL)
			{
				if (sc.Compare(((FMapOptInfo *)(*probe))->name))
				{
					if (!((FMapOptInfo *)(*probe))->old && format_type != FMT_New)
					{
						sc.ScriptError("MAPINFO option '%s' requires the new MAPINFO format", sc.String);
					}
					((FMapOptInfo *)(*probe))->handler(*this, &info);
					success = true;
					break;
				}
			}

			if (!success)
			{
				if (!ParseCloseBrace())
				{
					// Unknown
					sc.ScriptMessage("Unknown property '%s' found in map definition\n", sc.String);
					SkipToNext();
				}
				else
				{
					break;
				}
			}
		}
	}
	CheckEndOfFile("map");
}